

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename_pattern.cpp
# Opt level: O2

string * __thiscall
duckdb::FilenamePattern::CreateFilename
          (string *__return_storage_ptr__,FilenamePattern *this,FileSystem *fs,string *path,
          string *extension,idx_t offset)

{
  string *psVar1;
  hugeint_t hVar2;
  hugeint_t input;
  string replacement;
  string result;
  string local_b0;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  psVar1 = path;
  ::std::__cxx11::string::string((string *)&local_70,(string *)this);
  local_90 = local_80;
  local_88 = 0;
  local_80[0] = 0;
  if (this->uuid == true) {
    hVar2 = UUID::GenerateRandomUUID();
    input.lower = hVar2.upper;
    input.upper = (int64_t)psVar1;
    BaseUUID::ToString_abi_cxx11_(&local_b0,(BaseUUID *)hVar2.lower,input);
  }
  else {
    ::std::__cxx11::to_string(&local_b0,offset);
  }
  ::std::__cxx11::string::operator=((string *)&local_90,(string *)&local_b0);
  ::std::__cxx11::string::~string((string *)&local_b0);
  ::std::__cxx11::string::insert((ulong)&local_70,(string *)this->pos);
  ::std::operator+(&local_50,&local_70,".");
  ::std::operator+(&local_b0,&local_50,extension);
  FileSystem::JoinPath(__return_storage_ptr__,fs,path,&local_b0);
  ::std::__cxx11::string::~string((string *)&local_b0);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

string FilenamePattern::CreateFilename(FileSystem &fs, const string &path, const string &extension,
                                       idx_t offset) const {
	string result(base);
	string replacement;

	if (uuid) {
		replacement = UUID::ToString(UUID::GenerateRandomUUID());
	} else {
		replacement = std::to_string(offset);
	}
	result.insert(pos, replacement);
	return fs.JoinPath(path, result + "." + extension);
}